

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void setMemSize(void)

{
  char *pcVar1;
  long lVar2;
  int size;
  int local_c;
  
  local_c = 0x800;
  pcVar1 = strtok((char *)0x0,"");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "have no enough args";
    lVar2 = 0x13;
  }
  else {
    __isoc99_sscanf(pcVar1,"%d",&local_c);
    reset(local_c);
    pcVar1 = "mem size changed. all of mem and process info have been reset.";
    lVar2 = 0x3e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void setMemSize() {
    // 获取参数
    char *p;
    int size = DEFAULT_MEM_SIZE;
    p = strtok(NULL, "");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &size);

    // 重置
    reset(size);

    cout << "mem size changed. all of mem and process info have been reset." << endl;
}